

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O0

void __thiscall ManyDoublesRoundtripTest::~ManyDoublesRoundtripTest(ManyDoublesRoundtripTest *this)

{
  ManyDoublesRoundtripTest *this_local;
  
  ThreadedTest::~ThreadedTest(&this->super_ThreadedTest);
  return;
}

Assistant:

static LiteralType ClassifyDouble(uint64_t double_bits) {
    if (is_infinity_or_nan(double_bits)) {
      if (double_bits & 0xfffffffffffffULL) {
        return LiteralType::Nan;
      } else {
        return LiteralType::Infinity;
      }
    } else {
      return LiteralType::Hexfloat;
    }
  }